

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel_p.h
# Opt level: O2

size_t QtPrivate::qHash(QModelIndexWrapper *index,size_t seed)

{
  QHashMultiReturnType<int,_int,_unsigned_long_long> QVar1;
  long in_FS_OFFSET;
  quintptr local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = (index->index).r;
  local_10 = (index->index).c;
  local_18 = (index->index).i;
  QVar1 = qHashMulti<int,int,unsigned_long_long>(seed,&local_c,&local_10,&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline size_t qHash(const QtPrivate::QModelIndexWrapper &index, size_t seed = 0) noexcept
    {
        return qHashMulti(seed, index.index.row(), index.index.column(), index.index.internalId());
    }